

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

__pid_t __thiscall subprocess::Popen::wait(Popen *this,void *__stat_loc)

{
  long lVar1;
  pair<int,_int> this_00;
  int *piVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  int status;
  int ret;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  pair<int,_int> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffa0;
  uint local_50;
  allocator<char> *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  uint local_30;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = util::wait_for_child_exit(in_stack_ffffffffffffff7c);
  std::tie<int,int>((int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::tuple<int&,int&>::operator=
            ((tuple<int_&,_int_&> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90);
  if (local_2c == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 10) {
      uVar3 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      __errno_location();
      OSError::OSError((OSError *)this,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar3,&OSError::typeinfo,OSError::~OSError);
      }
      goto LAB_00f803d3;
    }
    local_50 = 0;
  }
  else if ((local_30 & 0x7f) == 0) {
    local_50 = (int)(local_30 & 0xff00) >> 8;
  }
  else if ((char)(((byte)local_30 & 0x7f) + 1) >> 1 < '\x01') {
    local_50 = 0xff;
  }
  else {
    local_50 = local_30 & 0x7f;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_50;
  }
LAB_00f803d3:
  __stack_chk_fail();
}

Assistant:

inline int Popen::wait() noexcept(false)
{
#ifdef __USING_WINDOWS__
  int ret = WaitForSingleObject(process_handle_, INFINITE);

  return 0;
#else
  int ret, status;
  std::tie(ret, status) = util::wait_for_child_exit(child_pid_);
  if (ret == -1) {
    if (errno != ECHILD) throw OSError("waitpid failed", errno);
    return 0;
  }
  if (WIFEXITED(status)) return WEXITSTATUS(status);
  if (WIFSIGNALED(status)) return WTERMSIG(status);
  else return 255;

  return 0;
#endif
}